

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessenger.cxx
# Opt level: O1

void __thiscall
cmMessenger::IssueMessage
          (cmMessenger *this,MessageType t,string *text,cmListFileBacktrace *backtrace)

{
  bool bVar1;
  MessageType t_00;
  
  if (t < FATAL_ERROR) {
    t_00 = (uint)this->DevWarningsAsErrors;
  }
  else {
    t_00 = t;
    if (t - DEPRECATION_ERROR < 2) {
      t_00 = DEPRECATION_WARNING - this->DeprecatedWarningsAsErrors;
    }
  }
  if (t_00 == t) {
    bVar1 = IsMessageTypeVisible(this,t_00);
    if (!bVar1) {
      return;
    }
  }
  DisplayMessage(this,t_00,text,backtrace);
  return;
}

Assistant:

void cmMessenger::IssueMessage(MessageType t, const std::string& text,
                               const cmListFileBacktrace& backtrace) const
{
  bool force = false;
  // override the message type, if needed, for warnings and errors
  MessageType override = this->ConvertMessageType(t);
  if (override != t) {
    t = override;
    force = true;
  }

  if (force || this->IsMessageTypeVisible(t)) {
    this->DisplayMessage(t, text, backtrace);
  }
}